

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::InternReadFile
          (MDLImporter *this,string *pFile,aiScene *_pScene,IOSystem *_pIOHandler)

{
  IOSystem *this_00;
  uint uVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *pDVar3;
  uchar *puVar4;
  Logger *pLVar5;
  aiMatrix4x4t<float> local_1c4;
  undefined1 local_182;
  allocator local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  uchar *local_e0;
  HalfLifeMDLBaseHeader *pHeader;
  uint32_t iMagicWord;
  undefined1 local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *_pIOHandler_local;
  aiScene *_pScene_local;
  string *pFile_local;
  MDLImporter *this_local;
  
  this->pScene = _pScene;
  this->pIOHandler = _pIOHandler;
  this_00 = this->pIOHandler;
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       _pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(this_00,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    local_a9 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open MDL file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_88);
    local_a9 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  uVar1 = (*pIVar2->_vptr_IOStream[6])();
  this->iFileSize = uVar1;
  if (0x53 < this->iFileSize) {
    puVar4 = (uchar *)operator_new__((ulong)(this->iFileSize + 1));
    this->mBuffer = puVar4;
    pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                       (&local_30);
    (*pIVar2->_vptr_IOStream[2])(pIVar2,this->mBuffer,1,(ulong)this->iFileSize);
    this->mBuffer[this->iFileSize] = '\0';
    pHeader._0_4_ = *(uint32_t *)this->mBuffer;
    if (((uint32_t)pHeader == 0x4944504f) || ((uint32_t)pHeader == 0x4f504449)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: Quake 1, magic word is IDPO");
      this->iGSFileVersion = 0;
      InternReadFile_Quake1(this);
    }
    else if (((uint32_t)pHeader == 0x4d444c32) || ((uint32_t)pHeader == 0x324c444d)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A2, magic word is MDL2");
      this->iGSFileVersion = 2;
      InternReadFile_Quake1(this);
    }
    else if (((uint32_t)pHeader == 0x4d444c33) || ((uint32_t)pHeader == 0x334c444d)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A4, magic word is MDL3");
      this->iGSFileVersion = 3;
      InternReadFile_3DGS_MDL345(this);
    }
    else if (((uint32_t)pHeader == 0x4d444c34) || ((uint32_t)pHeader == 0x344c444d)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A4, magic word is MDL4");
      this->iGSFileVersion = 4;
      InternReadFile_3DGS_MDL345(this);
    }
    else if (((uint32_t)pHeader == 0x4d444c35) || ((uint32_t)pHeader == 0x354c444d)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A5, magic word is MDL5");
      this->iGSFileVersion = 5;
      InternReadFile_3DGS_MDL345(this);
    }
    else if (((uint32_t)pHeader == 0x4d444c37) || ((uint32_t)pHeader == 0x374c444d)) {
      pLVar5 = DefaultLogger::get();
      Logger::debug(pLVar5,"MDL subtype: 3D GameStudio A7, magic word is MDL7");
      this->iGSFileVersion = 7;
      InternReadFile_3DGS_MDL7(this);
    }
    else {
      if (((((uint32_t)pHeader != 0x49445354) && ((uint32_t)pHeader != 0x54534449)) &&
          ((uint32_t)pHeader != 0x49445351)) && ((uint32_t)pHeader != 0x51534449)) {
        local_182 = 1;
        pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::operator+(&local_160,"Unknown MDL subformat ",pFile);
        std::operator+(&local_140,&local_160,". Magic word (");
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_180,(char *)&pHeader,4,&local_181);
        std::operator+(&local_120,&local_140,&local_180);
        std::operator+(&local_100,&local_120,") is not known");
        DeadlyImportError::DeadlyImportError(pDVar3,&local_100);
        local_182 = 0;
        __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      this->iGSFileVersion = 0;
      local_e0 = this->mBuffer;
      if (*(int *)(local_e0 + 4) == 10) {
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"MDL subtype: Half-Life 1/Goldsrc Engine, magic word is IDST/IDSQ");
        InternReadFile_HL1(this,pFile,(uint32_t)pHeader);
      }
      else {
        pLVar5 = DefaultLogger::get();
        Logger::debug(pLVar5,"MDL subtype: Source(tm) Engine, magic word is IDST/IDSQ");
        InternReadFile_HL2(this);
      }
    }
    aiMatrix4x4t<float>::aiMatrix4x4t
              (&local_1c4,1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0);
    memcpy(&this->pScene->mRootNode->mTransformation,&local_1c4,0x40);
    if (this->mBuffer != (uchar *)0x0) {
      operator_delete__(this->mBuffer);
    }
    this->mBuffer = (uchar *)0x0;
    this->pIOHandler = (IOSystem *)0x0;
    this->pScene = (aiScene *)0x0;
    std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr
              (&local_30);
    return;
  }
  pHeader._6_1_ = 1;
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iMagicWord,"MDL File is too small.",(allocator<char> *)((long)&pHeader + 7))
  ;
  DeadlyImportError::DeadlyImportError(pDVar3,(string *)&iMagicWord);
  pHeader._6_1_ = 0;
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void MDLImporter::InternReadFile( const std::string& pFile,
    aiScene* _pScene, IOSystem* _pIOHandler)
{
    pScene     = _pScene;
    pIOHandler = _pIOHandler;
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open MDL file " + pFile + ".");
    }

    // This should work for all other types of MDL files, too ...
    // the quake header is one of the smallest, afaik
    iFileSize = (unsigned int)file->FileSize();
    if( iFileSize < sizeof(MDL::Header)) {
        throw DeadlyImportError( "MDL File is too small.");
    }

    // Allocate storage and copy the contents of the file to a memory buffer
    mBuffer =new unsigned char[iFileSize+1];
    file->Read( (void*)mBuffer, 1, iFileSize);

    // Append a binary zero to the end of the buffer.
    // this is just for safety that string parsing routines
    // find the end of the buffer ...
    mBuffer[iFileSize] = '\0';
    const uint32_t iMagicWord = *((uint32_t*)mBuffer);

    // Determine the file subtype and call the appropriate member function

    // Original Quake1 format
    if (AI_MDL_MAGIC_NUMBER_BE == iMagicWord || AI_MDL_MAGIC_NUMBER_LE == iMagicWord)   {
        ASSIMP_LOG_DEBUG("MDL subtype: Quake 1, magic word is IDPO");
        iGSFileVersion = 0;
        InternReadFile_Quake1();
    }
    // GameStudio A<old> MDL2 format - used by some test models that come with 3DGS
    else if (AI_MDL_MAGIC_NUMBER_BE_GS3 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS3 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A2, magic word is MDL2");
        iGSFileVersion = 2;
        InternReadFile_Quake1();
    }
    // GameStudio A4 MDL3 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS4 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS4 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A4, magic word is MDL3");
        iGSFileVersion = 3;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A5+ MDL4 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS5a == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS5a == iMagicWord)    {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A4, magic word is MDL4");
        iGSFileVersion = 4;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A5+ MDL5 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS5b == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS5b == iMagicWord)    {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A5, magic word is MDL5");
        iGSFileVersion = 5;
        InternReadFile_3DGS_MDL345();
    }
    // GameStudio A7 MDL7 format
    else if (AI_MDL_MAGIC_NUMBER_BE_GS7 == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_GS7 == iMagicWord)  {
        ASSIMP_LOG_DEBUG("MDL subtype: 3D GameStudio A7, magic word is MDL7");
        iGSFileVersion = 7;
        InternReadFile_3DGS_MDL7();
    }
    // IDST/IDSQ Format (CS:S/HL^2, etc ...)
    else if (AI_MDL_MAGIC_NUMBER_BE_HL2a == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_HL2a == iMagicWord ||
        AI_MDL_MAGIC_NUMBER_BE_HL2b == iMagicWord || AI_MDL_MAGIC_NUMBER_LE_HL2b == iMagicWord)
    {
        iGSFileVersion = 0;

        HalfLife::HalfLifeMDLBaseHeader *pHeader = (HalfLife::HalfLifeMDLBaseHeader *)mBuffer;
        if (pHeader->version == AI_MDL_HL1_VERSION)
        {
            ASSIMP_LOG_DEBUG("MDL subtype: Half-Life 1/Goldsrc Engine, magic word is IDST/IDSQ");
            InternReadFile_HL1(pFile, iMagicWord);
        }
        else
        {
            ASSIMP_LOG_DEBUG("MDL subtype: Source(tm) Engine, magic word is IDST/IDSQ");
            InternReadFile_HL2();
        }
    }
    else    {
        // print the magic word to the log file
        throw DeadlyImportError( "Unknown MDL subformat " + pFile +
            ". Magic word (" + std::string((char*)&iMagicWord,4) + ") is not known");
    }

    // Now rotate the whole scene 90 degrees around the x axis to convert to internal coordinate system
    pScene->mRootNode->mTransformation = aiMatrix4x4(1.f,0.f,0.f,0.f,
        0.f,0.f,1.f,0.f,0.f,-1.f,0.f,0.f,0.f,0.f,0.f,1.f);

    // delete the file buffer and cleanup
    delete [] mBuffer;
    mBuffer= nullptr;
    AI_DEBUG_INVALIDATE_PTR(pIOHandler);
    AI_DEBUG_INVALIDATE_PTR(pScene);
}